

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrenum.cpp
# Opt level: O0

UChar * __thiscall
icu_63::StringEnumeration::unext(StringEnumeration *this,int32_t *resultLength,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  int32_t iVar3;
  undefined4 extraout_var;
  UnicodeString *s;
  UErrorCode *status_local;
  int32_t *resultLength_local;
  StringEnumeration *this_local;
  
  iVar2 = (*(this->super_UObject)._vptr_UObject[7])(this,status);
  UVar1 = ::U_SUCCESS(*status);
  if ((UVar1 == '\0') || ((UnicodeString *)CONCAT44(extraout_var,iVar2) == (UnicodeString *)0x0)) {
    this_local = (StringEnumeration *)0x0;
  }
  else {
    UnicodeString::operator=(&this->unistr,(UnicodeString *)CONCAT44(extraout_var,iVar2));
    if (resultLength != (int32_t *)0x0) {
      iVar3 = UnicodeString::length(&this->unistr);
      *resultLength = iVar3;
    }
    this_local = (StringEnumeration *)UnicodeString::getTerminatedBuffer(&this->unistr);
  }
  return (UChar *)this_local;
}

Assistant:

const UChar *
StringEnumeration::unext(int32_t *resultLength, UErrorCode &status) {
    const UnicodeString *s=snext(status);
    if(U_SUCCESS(status) && s!=NULL) {
        unistr=*s;
        if(resultLength!=NULL) {
            *resultLength=unistr.length();
        }
        return unistr.getTerminatedBuffer();
    }

    return NULL;
}